

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O3

void Fxu_HeapSingleMoveUp(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  Fxu_Single **ppFVar1;
  int iVar2;
  uint uVar3;
  Fxu_Single *pFVar4;
  Fxu_Single *pFVar5;
  Fxu_Single *pSingle_1;
  uint uVar6;
  Fxu_Single **ppFVar7;
  
  pFVar4 = p->pTree[(int)pSingle];
  if (1 < pFVar4->HNum) {
    iVar2 = pFVar4->Weight;
    ppFVar7 = p->pTree + (int)pSingle;
    uVar6 = pFVar4->HNum;
    do {
      pFVar5 = p->pTree[uVar6 >> 1];
      if (iVar2 <= pFVar5->Weight) {
        return;
      }
      ppFVar1 = p->pTree + (uVar6 >> 1);
      *ppFVar7 = pFVar5;
      *ppFVar1 = pFVar4;
      uVar3 = (*ppFVar7)->HNum;
      (*ppFVar7)->HNum = uVar6;
      pFVar4->HNum = uVar3;
      ppFVar7 = ppFVar1;
      uVar6 = uVar3;
    } while (1 < (int)uVar3);
  }
  return;
}

Assistant:

void Fxu_HeapSingleMoveUp( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
    Fxu_Single ** ppSingle, ** ppPar;
    ppSingle = &FXU_HEAP_SINGLE_CURRENT(p, pSingle);
    while ( FXU_HEAP_SINGLE_PARENT_EXISTS(p,*ppSingle) )
    {
        ppPar = &FXU_HEAP_SINGLE_PARENT(p,*ppSingle);
        if ( FXU_HEAP_SINGLE_WEIGHT(*ppSingle) > FXU_HEAP_SINGLE_WEIGHT(*ppPar) )
        {
            Fxu_HeapSingleSwap( ppSingle, ppPar );
            ppSingle = ppPar;
        }
        else
            break;
    }
}